

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_array_nested_array(void)

{
  bool v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_00;
  type *local_2a0;
  basic_variable<std::allocator<char>_> *local_288;
  iterator local_268;
  iterator local_250;
  iterator local_238;
  iterator local_220;
  undefined1 local_201;
  type *local_200;
  type local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  type local_138;
  basic_variable<std::allocator<char>_> local_118;
  basic_variable<std::allocator<char>_> local_e8;
  undefined1 local_b8 [24];
  variable expect;
  basic_variable<std::allocator<char>_> result;
  allocator<char> local_29;
  string local_28 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,"[null,[true,2,3.0,\"alpha\"]]",&local_29);
  std::allocator<char>::~allocator(&local_29);
  trial::protocol::json::parse<std::__cxx11::string,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28,(json *)local_28,
             input_00);
  v = trial::dynamic::basic_variable<std::allocator<char>>::
      is<trial::dynamic::basic_array<std::allocator<char>>>
                ((basic_variable<std::allocator<char>> *)&expect.storage.field_0x28);
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,300,"void parser_suite::parse_array_nested_array()",v);
  local_201 = 1;
  local_138._24_8_ = &local_118;
  local_138._20_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138._24_8_,
             (nullable *)(local_138.__data + 0x14));
  local_200 = &local_1f8;
  local_138._24_8_ = &local_e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&local_200->__align,true);
  local_200 = (type *)&local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&local_200->__align,2);
  local_200 = (type *)&local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&local_200->__align,3.0);
  local_200 = (type *)&local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&local_200->__align,"alpha");
  local_138._0_8_ = &local_1f8;
  local_138._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_e8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             &local_138.__align);
  local_201 = 0;
  local_b8._0_8_ = &local_118;
  local_b8._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_b8);
  local_288 = (basic_variable<std::allocator<char>_> *)local_b8;
  do {
    local_288 = local_288 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_288);
  } while (local_288 != &local_118);
  local_2a0 = &local_138;
  do {
    local_2a0 = (type *)((long)local_2a0 + -0x30);
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)&local_2a0->__align);
  } while (local_2a0 != &local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_220,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_238,(basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_250,(basic_variable<std::allocator<char>_> *)(local_b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_268,(basic_variable<std::allocator<char>_> *)(local_b8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/parse_suite.cpp"
             ,0x131,"void parser_suite::parse_array_nested_array()",&local_220,&local_238,&local_250
             ,&local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_250);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_220);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expect.storage.field_0x28);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void parse_array_nested_array()
{
    std::string input = "[null,[true,2,3.0,\"alpha\"]]";
    auto result = json::parse(input);
    TRIAL_PROTOCOL_TEST(result.is<array>());

    variable expect = { null, { true, 2, 3.0, "alpha" } };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}